

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

string_view __thiscall
libtorrent::bdecode_node::list_string_value_at(bdecode_node *this,int i,string_view default_val)

{
  bdecode_node n;
  bdecode_node bStack_58;
  
  list_at(&bStack_58,this,i);
  if (((long)bStack_58.m_token_idx != -1) &&
     ((*(uint *)(bStack_58.m_root_tokens + bStack_58.m_token_idx) >> 0x1d == 5 ||
      (*(uint *)(bStack_58.m_root_tokens + bStack_58.m_token_idx) >> 0x1d == 3)))) {
    default_val = string_value(&bStack_58);
  }
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&bStack_58);
  return default_val;
}

Assistant:

string_view bdecode_node::list_string_value_at(int i
		, string_view default_val) const
	{
		bdecode_node const n = list_at(i);
		if (n.type() != bdecode_node::string_t) return default_val;
		return n.string_value();
	}